

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::commoditizedUnit(string *unit_string,uint64_t match_flags)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>
  __l;
  precise_unit pVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  precise_unit pVar5;
  const_iterator tunit;
  precise_unit bunit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cstring;
  int ccindex;
  size_type finish;
  uint64_t in_stack_00000a88;
  string *in_stack_00000a90;
  unit *in_stack_fffffffffffffb68;
  uint32_t commodity_code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  undefined7 in_stack_fffffffffffffb80;
  char in_stack_fffffffffffffb87;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb88;
  precise_unit *in_stack_fffffffffffffb90;
  iterator in_stack_fffffffffffffb98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  *in_stack_fffffffffffffba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb0;
  undefined1 **local_430;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  local_3e0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  in_stack_fffffffffffffc28;
  undefined1 local_3cb [11];
  undefined1 *local_3c0 [6];
  undefined1 local_390 [48];
  undefined1 local_360 [48];
  undefined1 local_330 [48];
  undefined1 local_300 [48];
  undefined1 local_2d0 [48];
  undefined1 local_2a0 [48];
  undefined1 local_270 [48];
  undefined1 local_240 [48];
  undefined1 local_210 [48];
  undefined1 local_1e0 [48];
  undefined1 local_1b0 [48];
  undefined1 local_180 [48];
  undefined1 local_150 [48];
  undefined1 local_120 [48];
  undefined1 local_f0 [48];
  undefined8 *local_c0;
  undefined8 local_b8;
  precise_unit local_90;
  undefined4 local_80;
  int local_2c;
  size_type local_28;
  double local_10;
  undefined8 local_8;
  
  local_28 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_last_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffb70,(char)((ulong)in_stack_fffffffffffffb68 >> 0x38)
                          ,0x7a04a0);
  if (local_28 == 0xffffffffffffffff) {
    local_10 = NAN;
    local_8 = 0xfa94a488;
    goto LAB_007a0c89;
  }
  local_2c = (int)local_28 + -1;
  segmentcheckReverse(in_stack_fffffffffffffb88,in_stack_fffffffffffffb87,
                      (int *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (in_stack_fffffffffffffb88,CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80)
             ,CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  if (local_2c < 0) {
    std::__cxx11::string::string(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    uVar4 = (uint32_t)((ulong)in_stack_fffffffffffffb68 >> 0x20);
    getCommodity((string *)in_stack_fffffffffffffc28._M_cur);
    precise_unit::precise_unit
              ((precise_unit *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
               (double)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
               (precise_unit *)in_stack_fffffffffffffb70,uVar4);
    std::__cxx11::string::~string(in_stack_fffffffffffffb70);
    pVar5.base_units_ = (unit_data)(undefined4)local_8;
    pVar5.commodity_ = local_8._4_4_;
    pVar5.multiplier_ = (double)in_stack_fffffffffffffbb0;
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_fffffffffffffb88,
               CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
               CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    local_90 = unit_from_string_internal(in_stack_00000a90,in_stack_00000a88);
    std::__cxx11::string::~string(in_stack_fffffffffffffb70);
    bVar2 = is_error((precise_unit *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
    if (bVar2) {
      local_10 = NAN;
      pVar5.base_units_ = (unit_data)0xfa94a488;
      pVar5.commodity_ = 0;
      pVar5.multiplier_ = (double)in_stack_fffffffffffffbb0;
    }
    else {
      bVar2 = precise_unit::has_same_base
                        ((precise_unit *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
      if (bVar2) {
        if (commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::commUnits_abi_cxx11_ ==
            '\0') {
          iVar3 = __cxa_guard_acquire(&commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::
                                       commUnits_abi_cxx11_);
          if (iVar3 != 0) {
            local_3cb._3_8_ = local_3c0;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[8],_true>
                      (in_stack_fffffffffffffba0,(char (*) [8])in_stack_fffffffffffffb98,
                       in_stack_fffffffffffffb90);
            local_3cb._3_8_ = local_390;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[14],_true>
                      (in_stack_fffffffffffffba0,(char (*) [14])in_stack_fffffffffffffb98,
                       in_stack_fffffffffffffb90);
            local_3cb._3_8_ = local_360;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[13],_true>
                      (in_stack_fffffffffffffba0,(char (*) [13])in_stack_fffffffffffffb98,
                       in_stack_fffffffffffffb90);
            local_3cb._3_8_ = local_330;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[10],_true>
                      (in_stack_fffffffffffffba0,(char (*) [10])in_stack_fffffffffffffb98,
                       in_stack_fffffffffffffb90);
            local_3cb._3_8_ = local_300;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[3],_true>
                      (in_stack_fffffffffffffba0,(char (*) [3])in_stack_fffffffffffffb98,
                       in_stack_fffffffffffffb90);
            local_3cb._3_8_ = local_2d0;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[6],_true>
                      (in_stack_fffffffffffffba0,(char (*) [6])in_stack_fffffffffffffb98,
                       in_stack_fffffffffffffb90);
            local_3cb._3_8_ = local_2a0;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[12],_true>
                      (in_stack_fffffffffffffba0,(char (*) [12])in_stack_fffffffffffffb98,
                       in_stack_fffffffffffffb90);
            local_3cb._3_8_ = local_270;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[8],_true>
                      (in_stack_fffffffffffffba0,(char (*) [8])in_stack_fffffffffffffb98,
                       in_stack_fffffffffffffb90);
            local_3cb._3_8_ = local_240;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[11],_true>
                      (in_stack_fffffffffffffba0,(char (*) [11])in_stack_fffffffffffffb98,
                       in_stack_fffffffffffffb90);
            local_3cb._3_8_ = local_210;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[4],_true>
                      (in_stack_fffffffffffffba0,(char (*) [4])in_stack_fffffffffffffb98,
                       in_stack_fffffffffffffb90);
            local_3cb._3_8_ = local_1e0;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[13],_true>
                      (in_stack_fffffffffffffba0,(char (*) [13])in_stack_fffffffffffffb98,
                       in_stack_fffffffffffffb90);
            local_3cb._3_8_ = local_1b0;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[11],_true>
                      (in_stack_fffffffffffffba0,(char (*) [11])in_stack_fffffffffffffb98,
                       in_stack_fffffffffffffb90);
            local_3cb._3_8_ = local_180;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[11],_true>
                      (in_stack_fffffffffffffba0,(char (*) [11])in_stack_fffffffffffffb98,
                       in_stack_fffffffffffffb90);
            local_3cb._3_8_ = local_150;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[13],_true>
                      (in_stack_fffffffffffffba0,(char (*) [13])in_stack_fffffffffffffb98,
                       in_stack_fffffffffffffb90);
            local_3cb._3_8_ = local_120;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[13],_true>
                      (in_stack_fffffffffffffba0,(char (*) [13])in_stack_fffffffffffffb98,
                       in_stack_fffffffffffffb90);
            local_3cb._3_8_ = local_f0;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[11],_true>
                      (in_stack_fffffffffffffba0,(char (*) [11])in_stack_fffffffffffffb98,
                       in_stack_fffffffffffffb90);
            local_c0 = local_3c0;
            local_b8 = 0x10;
            in_stack_fffffffffffffb68 = (unit *)local_3cb;
            std::
            allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>
            ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>
                         *)0x7a0960);
            __l._M_len = (size_type)in_stack_fffffffffffffba0;
            __l._M_array = in_stack_fffffffffffffb98;
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
            ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                             *)in_stack_fffffffffffffb90,__l,(size_type)in_stack_fffffffffffffb88,
                            (hasher *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                            (key_equal *)
                            CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                            (allocator_type *)in_stack_fffffffffffffbb0);
            std::
            allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>
            ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>
                          *)local_3cb);
            local_430 = (undefined1 **)&local_c0;
            do {
              local_430 = local_430 + -6;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
              ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
                       *)0x7a09d5);
            } while (local_430 != local_3c0);
            __cxa_atexit(std::
                         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                         ::~unordered_map,
                         &commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::
                          commUnits_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::
                                 commUnits_abi_cxx11_);
          }
        }
        in_stack_fffffffffffffc28._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                     *)in_stack_fffffffffffffb68,(key_type *)0x7a0a23);
        local_3e0._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                    *)in_stack_fffffffffffffb68);
        bVar2 = std::__detail::operator==
                          ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                            *)&stack0xfffffffffffffc28,&local_3e0);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          std::__detail::
          _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_false,_true>
          ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_false,_true>
                        *)0x7a0a78);
          pVar5 = precise_unit::operator*
                            (in_stack_fffffffffffffb90,(precise_unit *)in_stack_fffffffffffffb88);
          local_10 = pVar5.multiplier_;
          goto LAB_007a0c6b;
        }
      }
      commodity_code = (uint32_t)((ulong)in_stack_fffffffffffffb68 >> 0x20);
      std::__cxx11::string::string(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      uVar4 = getCommodity((string *)in_stack_fffffffffffffc28._M_cur);
      precise_unit::precise_unit
                ((precise_unit *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                 (double)CONCAT44(uVar4,in_stack_fffffffffffffb78),
                 (precise_unit *)in_stack_fffffffffffffb70,commodity_code);
      std::__cxx11::string::~string(in_stack_fffffffffffffb70);
      pVar5.base_units_ = (unit_data)(undefined4)local_8;
      pVar5.commodity_ = local_8._4_4_;
      pVar5.multiplier_ = (double)in_stack_fffffffffffffbb0;
    }
  }
LAB_007a0c6b:
  local_8 = pVar5._8_8_;
  local_80 = 1;
  std::__cxx11::string::~string(in_stack_fffffffffffffb70);
LAB_007a0c89:
  pVar1.base_units_ = (unit_data)(undefined4)local_8;
  pVar1.commodity_ = local_8._4_4_;
  pVar1.multiplier_ = local_10;
  return pVar1;
}

Assistant:

static precise_unit
    commoditizedUnit(const std::string& unit_string, std::uint64_t match_flags)
{
    auto finish = unit_string.find_last_of('}');
    if (finish == std::string::npos) {
        // there are checks before this would get called that would catch that
        // error but it is left in place just in case it gets called in an
        // isolated context

        // LCOV_EXCL_START
        return precise::invalid;
        // LCOV_EXCL_STOP
    }
    auto ccindex = static_cast<int>(finish) - 1;
    segmentcheckReverse(unit_string, '{', ccindex);

    auto cstring = unit_string.substr(
        static_cast<size_t>(ccindex) + 2, finish - ccindex - 2);

    if (ccindex < 0) {
        return {1.0, precise::one, getCommodity(cstring)};
    }

    auto bunit = unit_from_string_internal(
        unit_string.substr(0, static_cast<size_t>(ccindex) + 1),
        match_flags + no_commodities);
    if (!is_error(bunit)) {
        if (bunit.has_same_base(m)) {
            static const std::unordered_map<std::string, precise_unit>
                commUnits{
                    {"mercury", precise::pressure::bases::Hg},
                    {"mercurycolumn", precise::pressure::bases::Hg},
                    {"mercuryguage", precise::pressure::bases::Hg},
                    {"mercury_i", precise::pressure::bases::Hg},
                    {"Hg", precise::pressure::bases::Hg},
                    {"water", precise::pressure::bases::water},
                    {"watercolumn", precise::pressure::bases::water},
                    {"water_i", precise::pressure::bases::water},
                    {"waterguage", precise::pressure::bases::water},
                    {"H2O", precise::pressure::bases::water},
                    {"mercury_[00]", precise::pressure::bases::Hg_0},
                    {"water_[04]", precise::pressure::bases::water_4},
                    {"water_[39]", precise::pressure::bases::water_39},
                    {"mercury_[32]", precise::pressure::bases::Hg_32},
                    {"mercury_[60]", precise::pressure::bases::Hg_60},
                    {"water_[60]", precise::pressure::bases::water_60},
                };
            auto tunit = commUnits.find(cstring);
            if (tunit != commUnits.end()) {
                return bunit * tunit->second;
            }
        }
        return {1.0, bunit, getCommodity(cstring)};
    }
    return precise::invalid;
}